

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QCborArray>::relocate
          (QArrayDataPointer<QCborArray> *this,qsizetype offset,QCborArray **data)

{
  bool bVar1;
  QCborArray *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QCborArray *res;
  
  first = (QCborArray *)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<QCborArray,long_long>(first,in_RDI,(QCborArray *)0x4589b7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<QCborArray>,QCborArray_const*>
                        (data,(QArrayDataPointer<QCborArray> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(QCborArray **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }